

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O2

uchar MX_EQ(uint **a,uint a_rows,uint a_cols,uint **b,uint b_rows,uint b_cols)

{
  uint *puVar1;
  uint *puVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (b_cols != a_cols || b_rows != a_rows) {
    return '\0';
  }
  for (uVar3 = 0; uVar3 != a_rows; uVar3 = uVar3 + 1) {
    uVar4 = 0;
    while (a_cols != uVar4) {
      puVar1 = a[uVar3] + uVar4;
      puVar2 = b[uVar3] + uVar4;
      uVar4 = uVar4 + 1;
      if (*puVar1 != *puVar2) goto LAB_00101a84;
    }
  }
LAB_00101a84:
  return a_rows <= uVar3;
}

Assistant:

uint8_t MX_EQ(uint32_t **a, uint32_t a_rows, uint32_t a_cols,
          uint32_t **b, uint32_t b_rows, uint32_t b_cols)
{
    if (a_rows != b_rows)
        return 0;
    if (a_cols != b_cols)
        return 0;

    for (uint32_t i = 0; i < a_rows; i++)
        for (uint32_t j = 0; j < a_cols; j++)
            if (a[i][j] != b[i][j])
                return 0;
    return 1;
}